

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void __thiscall duckdb::Binder::SetBindingMode(Binder *this,BindingMode mode)

{
  Binder *pBVar1;
  
  pBVar1 = GetRootBinder(this);
  pBVar1->mode = mode;
  return;
}

Assistant:

void Binder::SetBindingMode(BindingMode mode) {
	auto &root_binder = GetRootBinder();
	root_binder.mode = mode;
}